

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O3

void LinkedList_AddEntry(LinkedList **start,void *toAdd,FAudioMutex lock,FAudioMallocFunc pMalloc)

{
  LinkedList *pLVar1;
  LinkedList *pLVar2;
  LinkedList *pLVar3;
  
  pLVar2 = (LinkedList *)(*pMalloc)(0x10);
  pLVar2->entry = toAdd;
  pLVar2->next = (LinkedList *)0x0;
  FAudio_PlatformLockMutex(lock);
  pLVar1 = *start;
  if (*start != (LinkedList *)0x0) {
    do {
      pLVar3 = pLVar1;
      pLVar1 = pLVar3->next;
    } while (pLVar1 != (LinkedList *)0x0);
    start = &pLVar3->next;
  }
  *start = pLVar2;
  FAudio_PlatformUnlockMutex(lock);
  return;
}

Assistant:

void LinkedList_AddEntry(
	LinkedList **start,
	void* toAdd,
	FAudioMutex lock,
	FAudioMallocFunc pMalloc
) {
	LinkedList *newEntry, *latest;
	newEntry = (LinkedList*) pMalloc(sizeof(LinkedList));
	newEntry->entry = toAdd;
	newEntry->next = NULL;
	FAudio_PlatformLockMutex(lock);
	if (*start == NULL)
	{
		*start = newEntry;
	}
	else
	{
		latest = *start;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = newEntry;
	}
	FAudio_PlatformUnlockMutex(lock);
}